

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BinaryAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::BinaryAssertionExpr,slang::ast::BinaryAssertionOperator&,slang::ast::AssertionExpr_const&,slang::ast::AssertionExpr_const&,slang::SourceRange>
          (BumpAllocator *this,BinaryAssertionOperator *args,AssertionExpr *args_1,
          AssertionExpr *args_2,SourceRange *args_3)

{
  SourceRange opRange;
  BinaryAssertionExpr *left;
  SourceLocation in_RCX;
  SourceLocation in_R8;
  AssertionExpr *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  left = (BinaryAssertionExpr *)
         allocate((BumpAllocator *)in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  opRange.endLoc = in_RCX;
  opRange.startLoc = in_R8;
  ast::BinaryAssertionExpr::BinaryAssertionExpr
            (*(BinaryAssertionExpr **)((long)in_R8 + 8),
             (BinaryAssertionOperator)((ulong)*(undefined8 *)in_R8 >> 0x20),(AssertionExpr *)left,
             in_stack_ffffffffffffffb8,opRange);
  return left;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }